

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.cpp
# Opt level: O2

void __thiscall
mjs::native_object::do_add_native_property
          (native_object *this,char *name,property_attribute attributes,get_func get,put_func put)

{
  uint __line;
  native_object_property *pnVar1;
  gc_vector<mjs::native_object::native_object_property> *this_00;
  char *__assertion;
  native_object_property nStack_68;
  
  pnVar1 = find(this,name);
  if (pnVar1 == (native_object_property *)0x0) {
    if (((put != (put_func)0x0 ^ (byte)attributes) & 1) != 0) {
      this_00 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::native_object::native_object_property>,_true>
                ::dereference(&this->native_properties_,(this->super_object).heap_);
      native_object_property::native_object_property(&nStack_68,name,attributes,get,put);
      gc_vector<mjs::native_object::native_object_property>::push_back(this_00,&nStack_68);
      return;
    }
    __assertion = 
    "((attributes & property_attribute::read_only) != property_attribute::none) == !put";
    __line = 0x38;
  }
  else {
    __assertion = "find(name) == nullptr";
    __line = 0x37;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/native_object.cpp"
                ,__line,
                "void mjs::native_object::do_add_native_property(const char *, property_attribute, get_func, put_func)"
               );
}

Assistant:

void native_object::do_add_native_property(const char* name, property_attribute attributes, get_func get, put_func put) {
    assert(find(name) == nullptr);
    assert(((attributes & property_attribute::read_only) != property_attribute::none) == !put);
    native_properties_.dereference(heap()).push_back(native_object_property(name, attributes, get, put));
}